

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

int iter_aux(lua_State *L,int strict)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  utfint code;
  size_t len;
  uint local_3c;
  ulong local_38;
  
  pcVar2 = luaL_checklstring(L,1,&local_38);
  iVar1 = 0;
  uVar3 = lua_tointegerx(L,2,(int *)0x0);
  if (uVar3 < local_38) {
    pcVar2 = utf8_decode(pcVar2 + uVar3,&local_3c,strict);
    if (pcVar2 == (char *)0x0) {
      iVar1 = luaL_error(L,"invalid UTF-8 code");
    }
    else {
      lua_pushinteger(L,uVar3 + 1);
      lua_pushinteger(L,(ulong)local_3c);
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

static int iter_aux (lua_State *L, int strict) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Unsigned n = (lua_Unsigned)lua_tointeger(L, 2);
  if (n < len) {
    while (iscontp(s + n)) n++;  /* go to next character */
  }
  if (n >= len)  /* (also handles original 'n' being negative) */
    return 0;  /* no more codepoints */
  else {
    utfint code;
    const char *next = utf8_decode(s + n, &code, strict);
    if (next == NULL || iscontp(next))
      return luaL_error(L, MSGInvalid);
    lua_pushinteger(L, n + 1);
    lua_pushinteger(L, code);
    return 2;
  }
}